

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

IRRef reassoc_trycse(jit_State *J,IROp op,IRRef op1,IRRef op2)

{
  ushort uVar1;
  IRIns *pIVar2;
  IRIns *ir;
  uint local_28;
  IRRef lim;
  IRRef ref;
  IRRef op2_local;
  IRRef op1_local;
  IROp op_local;
  jit_State *J_local;
  
  uVar1 = J->chain[op];
  ref = op1;
  lim = op2;
  if (op1 < op2) {
    ref = op2;
    lim = op1;
  }
  while( true ) {
    local_28 = (uint)uVar1;
    if (local_28 <= ref) {
      return 0;
    }
    pIVar2 = (J->cur).ir + local_28;
    if (((pIVar2->field_0).op1 == ref) && ((pIVar2->field_0).op2 == lim)) break;
    uVar1 = (pIVar2->field_0).prev;
  }
  return local_28;
}

Assistant:

static IRRef reassoc_trycse(jit_State *J, IROp op, IRRef op1, IRRef op2)
{
  IRRef ref = J->chain[op];
  IRRef lim = op1;
  if (op2 > lim) { lim = op2; op2 = op1; op1 = lim; }
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op1 == op1 && ir->op2 == op2)
      return ref;
    ref = ir->prev;
  }
  return 0;
}